

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int kinLsInitializeCounters(KINLsMem kinls_mem)

{
  kinls_mem->nps = 0;
  kinls_mem->ncfl = 0;
  kinls_mem->npe = 0;
  kinls_mem->nli = 0;
  kinls_mem->nje = 0;
  kinls_mem->nfeDQ = 0;
  kinls_mem->njtimes = 0;
  return 0;
}

Assistant:

int kinLsInitializeCounters(KINLsMem kinls_mem)
{
  kinls_mem->nje     = 0;
  kinls_mem->nfeDQ   = 0;
  kinls_mem->npe     = 0;
  kinls_mem->nli     = 0;
  kinls_mem->nps     = 0;
  kinls_mem->ncfl    = 0;
  kinls_mem->njtimes = 0;
  return(0);
}